

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl.h
# Opt level: O2

impl<8UL,_8UL,_false,_int> * __thiscall
avakar::_small_function::impl<8UL,_8UL,_false,_int>::operator=
          (impl<8UL,_8UL,_false,_int> *this,impl<8UL,_8UL,_false,_int> *o)

{
  vtable_t<int> *pvVar1;
  
  if (this->_vtable != (vtable_t<int> *)0x0) {
    (*this->_vtable->destroy)((byte *)this);
  }
  if (o->_vtable == (vtable_t<int> *)0x0) {
    pvVar1 = (vtable_t<int> *)0x0;
  }
  else {
    (*o->_vtable->move_destroy)((byte *)this,(byte *)o);
    pvVar1 = o->_vtable;
  }
  this->_vtable = pvVar1;
  o->_vtable = (vtable_t<int> *)0x0;
  return this;
}

Assistant:

impl & operator=(impl o) noexcept
	{
		if (_vtable)
			_vtable->destroy(this->data());
		if (o._vtable)
			o._vtable->move_destroy(this->data(), o.data());
		_vtable = o._vtable;
		o._vtable = nullptr;
		return *this;
	}